

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controlparser.cpp
# Opt level: O2

void __thiscall ControlParser::parseControlLine(ControlParser *this,string *line,Network *network)

{
  bool bVar1;
  InputError *pIVar2;
  string local_a8;
  string local_88;
  undefined1 local_68 [8];
  string keyword;
  allocator local_21;
  
  this->controlType = -1;
  this->link = (Link *)0x0;
  this->linkStatus = 2;
  this->nodeSetting = 0.0;
  this->levelType = 0;
  this->linkSetting = 0.0;
  this->node = (Node *)0x0;
  this->timeSetting = -1;
  std::ios::clear((int)*(undefined8 *)(*(long *)this + -0x18) + (int)this);
  std::__cxx11::stringbuf::str((string *)&this->field_0x10);
  local_68 = (undefined1  [8])&keyword._M_string_length;
  keyword._M_dataplus._M_p = (pointer)0x0;
  keyword._M_string_length._0_1_ = 0;
  std::operator>>((istream *)this,(string *)local_68);
  parseLinkSetting(this,network);
  std::operator>>((istream *)this,(string *)local_68);
  std::operator>>((istream *)this,(string *)local_68);
  if (((&this->field_0x20)[*(long *)(*(long *)this + -0x18)] & 2) != 0) {
    pIVar2 = (InputError *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&local_a8,"",(allocator *)(keyword.field_2._M_local_buf + 8));
    InputError::InputError(pIVar2,2,&local_a8);
    __cxa_throw(pIVar2,&InputError::typeinfo,ENerror::~ENerror);
  }
  std::__cxx11::string::string((string *)(keyword.field_2._M_local_buf + 8),"NODE",&local_21);
  bVar1 = Utilities::match((string *)local_68,(string *)((long)&keyword.field_2 + 8));
  std::__cxx11::string::~string((string *)(keyword.field_2._M_local_buf + 8));
  if (bVar1) {
    parseLevelSetting(this,network);
  }
  else {
    std::__cxx11::string::string((string *)(keyword.field_2._M_local_buf + 8),"TIME",&local_21);
    bVar1 = Utilities::match((string *)local_68,(string *)((long)&keyword.field_2 + 8));
    std::__cxx11::string::~string((string *)(keyword.field_2._M_local_buf + 8));
    if (bVar1) {
      parseTimeSetting(this);
    }
    else {
      std::__cxx11::string::string
                ((string *)(keyword.field_2._M_local_buf + 8),"CLOCKTIME",&local_21);
      bVar1 = Utilities::match((string *)local_68,(string *)((long)&keyword.field_2 + 8));
      std::__cxx11::string::~string((string *)(keyword.field_2._M_local_buf + 8));
      if (!bVar1) {
        pIVar2 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string((string *)&local_88,(string *)local_68);
        InputError::InputError(pIVar2,3,&local_88);
        __cxa_throw(pIVar2,&InputError::typeinfo,ENerror::~ENerror);
      }
      parseTimeOfDaySetting(this);
    }
  }
  createControl(this,network);
  std::__cxx11::string::~string((string *)local_68);
  return;
}

Assistant:

void ControlParser::parseControlLine(string& line, Network* network)

// Formats are:
//   LINK id OPEN/CLOSED/setting IF NODE id ABOVE/BELOW value
//   . . .                       AT TIME time
//   . . .                       AT CLOCKTIME time  (AM/PM)
// where time is in decimal hours or hrs:min:sec.

{
    // ... initialize
    initializeControlSettings();

    // ... skip over LINK keyword
    sin.clear();
    sin.str(line);
    string keyword;
    sin >> keyword;

    // ... get settings for link being controlled
    parseLinkSetting(network);

    //... skip next keyword
    sin >> keyword;

    //... get next keyword
    sin >> keyword;
    if (sin.eof()) throw InputError(InputError::TOO_FEW_ITEMS, "");

    //... get node control level if keyword == NODE
    if ( Utilities::match(keyword, w_NODE) ) parseLevelSetting(network);

    //... get control time if keyword == TIME
    else if ( Utilities::match(keyword, w_TIME) ) parseTimeSetting();

    //... get control time of day if keyword == CLOCKTIME
    else if ( Utilities::match(keyword, w_CLOCKTIME) ) parseTimeOfDaySetting();

    else throw InputError(InputError::INVALID_KEYWORD, keyword);

    //... create the control
    createControl(network);
}